

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_vector_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1337e35::MotionVectorTestLarge::PreEncodeFrameHook
          (MotionVectorTestLarge *this,VideoSource *video,Encoder *encoder)

{
  int iVar1;
  long *in_RSI;
  long in_RDI;
  int in_stack_00000048;
  int in_stack_0000004c;
  Encoder *in_stack_00000050;
  
  iVar1 = (**(code **)(*in_RSI + 0x40))();
  if (iVar1 == 0) {
    libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
    libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
    if (*(int *)(in_RDI + 0x3f4) != 0) {
      libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
      libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
      libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
    }
  }
  return;
}

Assistant:

void PreEncodeFrameHook(::libaom_test::VideoSource *video,
                          ::libaom_test::Encoder *encoder) override {
    if (video->frame() == 0) {
      encoder->Control(AOME_SET_CPUUSED, cpu_used_);
      encoder->Control(AV1E_ENABLE_MOTION_VECTOR_UNIT_TEST, mv_test_mode_);
      if (encoding_mode_ != ::libaom_test::kRealTime) {
        encoder->Control(AOME_SET_ENABLEAUTOALTREF, 1);
        encoder->Control(AOME_SET_ARNR_MAXFRAMES, 7);
        encoder->Control(AOME_SET_ARNR_STRENGTH, 5);
      }
    }
  }